

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int compose_pair(uint32_t c0,uint32_t c1)

{
  uint in_ESI;
  uint in_EDI;
  uint32_t in_stack_0000001c;
  uint32_t in_stack_00000020;
  undefined4 local_4;
  
  if ((((in_EDI < 0x1100) || (0x1112 < in_EDI)) || (in_ESI < 0x1161)) || (0x1175 < in_ESI)) {
    if (((in_EDI < 0xac00) || (0xd7a3 < in_EDI)) ||
       (((in_EDI - 0xac00) % 0x1c != 0 || ((in_ESI < 0x11a7 || (0x11c2 < in_ESI)))))) {
      local_4 = unicode_compose_pair(in_stack_00000020,in_stack_0000001c);
    }
    else {
      local_4 = in_EDI + in_ESI + -0x11a7;
    }
  }
  else {
    local_4 = (in_EDI - 0x1100) * 0x24c + 0xac00 + (in_ESI - 0x1161) * 0x1c;
  }
  return local_4;
}

Assistant:

static int compose_pair(uint32_t c0, uint32_t c1)
{
    /* Hangul composition */
    if (c0 >= 0x1100 && c0 < 0x1100 + 19 &&
        c1 >= 0x1161 && c1 < 0x1161 + 21) {
        return 0xac00 + (c0 - 0x1100) * 588 + (c1 - 0x1161) * 28;
    } else if (c0 >= 0xac00 && c0 < 0xac00 + 11172 &&
               (c0 - 0xac00) % 28 == 0 &&
               c1 >= 0x11a7 && c1 < 0x11a7 + 28) {
        return c0 + c1 - 0x11a7;
    } else {
        return unicode_compose_pair(c0, c1);
    }
}